

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O1

bool __thiscall
dynamicgraph::SignalPtr<double,_int>::needUpdate(SignalPtr<double,_int> *this,int *t)

{
  int iVar1;
  SignalBase<int> *pSVar2;
  undefined8 extraout_RDX;
  
  iVar1 = (*this->_vptr_SignalPtr[6])();
  if (((char)iVar1 != '\0') &&
     (this->signalPtr !=
      (Signal<double,_int> *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]))) {
    pSVar2 = getAbstractPtr(this);
    iVar1 = (*pSVar2->_vptr_SignalBase[9])(pSVar2,t,extraout_RDX,pSVar2->_vptr_SignalBase[9]);
    return SUB41(iVar1,0);
  }
  return (bool)(&this->field_0x2c)[(long)this->_vptr_SignalPtr[-3]];
}

Assistant:

bool SignalPtr<T, Time>::needUpdate(const Time &t) const {
  if ((isAbstractPluged()) && (!autoref())) {
    return getAbstractPtr()->needUpdate(t);
  } else
    return Signal<T, Time>::needUpdate(t);
}